

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::io::CordOutputStream::WriteCord(CordOutputStream *this,Cord *cord)

{
  anon_union_16_2_b9f6da03_for_Rep_1 local_28;
  
  local_28.long_rep.rep = (this->buffer_).rep_.field_0.long_rep.rep;
  local_28.long_rep.padding = (this->buffer_).rep_.field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.short_rep.raw_size = '\x01';
  absl::lts_20250127::Cord::Append(&this->cord_,(CordBuffer *)&local_28.long_rep);
  if (((ulong)local_28.long_rep.rep & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete(&(local_28.long_rep.rep)->super_CordRep);
  }
  absl::lts_20250127::Cord::Append(&this->cord_,cord);
  this->state_ = kSteal;
  return true;
}

Assistant:

bool CordOutputStream::WriteCord(const absl::Cord& cord) {
  cord_.Append(std::move(buffer_));
  cord_.Append(cord);
  state_ = State::kSteal;  // Attempt to utilize existing capacity in `cord'
  return true;
}